

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<int> * __thiscall
kj::_::NullableValue<int>::operator=(NullableValue<int> *this,NullableValue<int> *other)

{
  int *params;
  NullableValue<int> *other_local;
  NullableValue<int> *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<int>(&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      params = mv<int>(&(other->field_1).value);
      ctor<int,int>(&(this->field_1).value,params);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }